

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_9703::MemoryMappedFileTest_Map_Test::~MemoryMappedFileTest_Map_Test
          (MemoryMappedFileTest_Map_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MemoryMappedFileTest, Map) {
  std::string filename = GetExecutableDir() + "/test";
  WriteFile(filename, "abc");
  MemoryMappedFile<> f;
  File file(filename, File::RDONLY);
  f.map(file, filename);
  EXPECT_EQ("abc", std::string(f.start(), 3));
  EXPECT_EQ(3u, f.size());
}